

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registration_manager.cpp
# Opt level: O0

pair<std::shared_ptr<miniros::master::NodeRef>,_std::shared_ptr<miniros::master::NodeRef>_> *
__thiscall
miniros::master::RegistrationManager::registerNodeApi
          (RegistrationManager *this,string *caller_id,string *caller_api)

{
  Level LVar1;
  bool bVar2;
  size_type sVar3;
  pair<std::shared_ptr<miniros::master::NodeRef>,_std::shared_ptr<miniros::master::NodeRef>_>
  *in_RDI;
  bool enabled;
  NodeRefPtr prevNode;
  shared_ptr<miniros::master::NodeRef> node_ref;
  scoped_lock<std::mutex> lock;
  char *in_stack_fffffffffffffe78;
  key_type *in_stack_fffffffffffffe80;
  NodeRef *in_stack_fffffffffffffe88;
  pair<std::shared_ptr<miniros::master::NodeRef>,_std::shared_ptr<miniros::master::NodeRef>_>
  *in_stack_fffffffffffffe90;
  pair<std::shared_ptr<miniros::master::NodeRef>,_std::shared_ptr<miniros::master::NodeRef>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  LogLocation *in_stack_fffffffffffffeb0;
  key_type *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  string *in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffed8;
  byte in_stack_fffffffffffffedf;
  NodeRef *in_stack_fffffffffffffee0;
  undefined1 local_e1 [33];
  string local_c0 [32];
  string local_a0 [36];
  undefined4 local_7c;
  string local_78 [64];
  pair<std::shared_ptr<miniros::master::NodeRef>,_std::shared_ptr<miniros::master::NodeRef>_>
  local_38;
  
  ::std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_stack_fffffffffffffe80,
             (mutex_type *)in_stack_fffffffffffffe78);
  ::std::shared_ptr<miniros::master::NodeRef>::shared_ptr
            ((shared_ptr<miniros::master::NodeRef> *)0x544265);
  sVar3 = ::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>_>
                   *)in_stack_fffffffffffffe90,(key_type *)in_stack_fffffffffffffe88);
  if (sVar3 != 0) {
    in_stack_fffffffffffffee0 =
         (NodeRef *)
         ::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>_>
                       *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    ::std::shared_ptr<miniros::master::NodeRef>::operator=
              ((shared_ptr<miniros::master::NodeRef> *)in_stack_fffffffffffffe80,
               (shared_ptr<miniros::master::NodeRef> *)in_stack_fffffffffffffe78);
  }
  ::std::shared_ptr<miniros::master::NodeRef>::shared_ptr
            ((shared_ptr<miniros::master::NodeRef> *)0x5442f6);
  bVar2 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_38);
  if (bVar2) {
    ::std::__shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x544319);
    NodeRef::getApi_abi_cxx11_((NodeRef *)in_stack_fffffffffffffe78);
    in_stack_fffffffffffffedf =
         ::std::operator==(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    ::std::__cxx11::string::~string(local_78);
    if ((in_stack_fffffffffffffedf & 1) != 0) {
      ::std::
      pair<std::shared_ptr<miniros::master::NodeRef>,_std::shared_ptr<miniros::master::NodeRef>_>::
      pair<std::shared_ptr<miniros::master::NodeRef>_&,_std::shared_ptr<miniros::master::NodeRef>_&,_true>
                (in_stack_fffffffffffffe90,
                 (shared_ptr<miniros::master::NodeRef> *)in_stack_fffffffffffffe88,
                 (shared_ptr<miniros::master::NodeRef> *)in_stack_fffffffffffffe80);
      goto LAB_00544713;
    }
    ::std::shared_ptr<miniros::master::NodeRef>::operator=
              ((shared_ptr<miniros::master::NodeRef> *)in_stack_fffffffffffffe80,
               (shared_ptr<miniros::master::NodeRef> *)in_stack_fffffffffffffe78);
    if (((console::g_initialized ^ 0xff) & 1) != 0) {
      console::initialize();
    }
    if (((registerNodeApi::loc.initialized_ ^ 0xffU) & 1) != 0) {
      in_stack_fffffffffffffed0 = (string *)local_e1;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,
                 (allocator<char> *)in_stack_fffffffffffffeb0);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80);
      console::initializeLogLocation
                (in_stack_fffffffffffffeb0,
                 (string *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                 (Level)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      ::std::__cxx11::string::~string(local_a0);
      ::std::__cxx11::string::~string(local_c0);
      ::std::__cxx11::string::~string((string *)(local_e1 + 1));
      ::std::allocator<char>::~allocator((allocator<char> *)local_e1);
    }
    if (registerNodeApi::loc.level_ != Warn) {
      console::setLogLocationLevel
                ((LogLocation *)in_stack_fffffffffffffe80,
                 (Level)((ulong)in_stack_fffffffffffffe78 >> 0x20));
      console::checkLogLocationEnabled((LogLocation *)in_stack_fffffffffffffe90);
    }
    LVar1 = registerNodeApi::loc.level_;
    if ((registerNodeApi::loc.logger_enabled_ & 1U) != 0) {
      in_stack_fffffffffffffec0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           registerNodeApi::loc.logger_;
      in_stack_fffffffffffffe80 = (key_type *)::std::__cxx11::string::c_str();
      in_stack_fffffffffffffe88 = (NodeRef *)::std::__cxx11::string::c_str();
      in_stack_fffffffffffffe78 = "New node registered with name=\"%s\" api=%s";
      in_stack_fffffffffffffeb8 = in_stack_fffffffffffffe80;
      console::print((FilterBase *)0x0,in_stack_fffffffffffffec0,(Level)(ulong)LVar1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/registration_manager.cpp"
                     ,0xa5,
                     "std::pair<NodeRefPtr, NodeRefPtr> miniros::master::RegistrationManager::registerNodeApi(const std::string &, const std::string &)"
                    );
    }
    ::std::
    set<std::shared_ptr<miniros::master::NodeRef>,_std::less<std::shared_ptr<miniros::master::NodeRef>_>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>
    ::insert((set<std::shared_ptr<miniros::master::NodeRef>,_std::less<std::shared_ptr<miniros::master::NodeRef>_>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>
              *)in_stack_fffffffffffffea0,(value_type *)in_stack_fffffffffffffe98);
  }
  operator_new(0x1b8);
  NodeRef::NodeRef(in_stack_fffffffffffffee0,
                   (string *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
                   in_stack_fffffffffffffed0);
  ::std::__shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>::
  reset<miniros::master::NodeRef>
            ((__shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2> *)
             in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>_>
                *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  this_00 = &local_38;
  ::std::shared_ptr<miniros::master::NodeRef>::operator=
            ((shared_ptr<miniros::master::NodeRef> *)in_stack_fffffffffffffe80,
             (shared_ptr<miniros::master::NodeRef> *)in_stack_fffffffffffffe78);
  ::std::pair<std::shared_ptr<miniros::master::NodeRef>,_std::shared_ptr<miniros::master::NodeRef>_>
  ::
  pair<std::shared_ptr<miniros::master::NodeRef>_&,_std::shared_ptr<miniros::master::NodeRef>_&,_true>
            (this_00,(shared_ptr<miniros::master::NodeRef> *)in_stack_fffffffffffffe88,
             (shared_ptr<miniros::master::NodeRef> *)in_stack_fffffffffffffe80);
LAB_00544713:
  local_7c = 1;
  ::std::shared_ptr<miniros::master::NodeRef>::~shared_ptr
            ((shared_ptr<miniros::master::NodeRef> *)0x544720);
  ::std::shared_ptr<miniros::master::NodeRef>::~shared_ptr
            ((shared_ptr<miniros::master::NodeRef> *)0x54472d);
  ::std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x54473a);
  return in_RDI;
}

Assistant:

std::pair<NodeRefPtr, NodeRefPtr> RegistrationManager::registerNodeApi(const std::string& caller_id, const std::string& caller_api)
{
  std::scoped_lock<std::mutex> lock(m_guard);

  std::shared_ptr<NodeRef> node_ref;
  if (m_nodes.count(caller_id))
    node_ref = m_nodes[caller_id];

  NodeRefPtr prevNode;
  if (node_ref) {
    if (node_ref->getApi() == caller_api) {
      return {node_ref, prevNode};
    } else {
      prevNode = node_ref;
      MINIROS_WARN_NAMED("reg", "New node registered with name=\"%s\" api=%s", caller_id.c_str(), caller_api.c_str());
      m_nodesToShutdown.insert(node_ref);
    }
  }

  node_ref.reset(new NodeRef(caller_id, caller_api));
  m_nodes[caller_id] = node_ref;

  return {node_ref, prevNode};
}